

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseTagModuleField(WastParser *this,Module *module)

{
  undefined8 uVar1;
  bool bVar2;
  Result RVar3;
  Enum EVar4;
  long lVar5;
  allocator<char> local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  undefined1 local_120 [16];
  undefined1 local_110 [8];
  string name;
  undefined1 local_e8 [64];
  string local_a8 [32];
  _Head_base<0UL,_wabt::TagImport_*,_false> local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  ModuleFieldList export_fields;
  Location loc;
  
  if ((this->options_->features).exceptions_enabled_ == false) {
    Consume((Token *)local_e8,this);
    Error(this,0x1df7e4);
    return (Result)Error;
  }
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  RVar3 = Expect(this,Tag);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&name);
  export_fields.first_ = (ModuleField *)0x0;
  export_fields.last_ = (ModuleField *)0x0;
  export_fields.size_ = 0;
  RVar3 = ParseInlineExports(this,&export_fields,Last);
  EVar4 = Error;
  if (RVar3.enum_ == Error) goto LAB_0017ff37;
  bVar2 = PeekMatchLpar(this,Import);
  if (bVar2) {
    CheckImportOrdering(this,module);
    std::make_unique<wabt::TagImport,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
    uVar1 = local_120._0_8_;
    RVar3 = ParseInlineImport(this,(Import *)local_120._0_8_);
    if (((RVar3.enum_ != Error) &&
        (RVar3 = ParseTypeUseOpt(this,(FuncDeclaration *)(uVar1 + 0x70)), RVar3.enum_ != Error)) &&
       (RVar3 = ParseUnboundFuncSignature(this,(FuncSignature *)(uVar1 + 0xc0)),
       RVar3.enum_ != Error)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_e8,"type",&local_121);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_e8 + 0x20),"param",&local_122);
      std::__cxx11::string::string<std::allocator<char>>(local_a8,"result",&local_123);
      local_88._M_head_impl = (TagImport *)0x0;
      uStack_80 = 0;
      local_78 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                 (string *)local_e8,&local_88);
      RVar3 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_88,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88);
      lVar5 = 0x40;
      do {
        std::__cxx11::string::_M_dispose();
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x20);
      if (RVar3.enum_ != Error) {
        GetLocation((Location *)local_e8,this);
        std::
        make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::TagImport,std::default_delete<wabt::TagImport>>,wabt::Location>
                  ((unique_ptr<wabt::TagImport,_std::default_delete<wabt::TagImport>_> *)&local_88,
                   (Location *)local_120);
        local_110 = (undefined1  [8])local_88._M_head_impl;
        local_88._M_head_impl = (TagImport *)0x0;
        Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                    *)local_110);
        if (local_110 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_110 + 8))();
        }
        local_110 = (undefined1  [8])0x0;
        if (local_88._M_head_impl != (TagImport *)0x0) {
          (*((local_88._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.
            _vptr_Import[1])();
        }
        goto LAB_0017fefa;
      }
    }
  }
  else {
    std::make_unique<wabt::TagModuleField,wabt::Location&,std::__cxx11::string&>
              ((Location *)local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc);
    RVar3 = ParseTypeUseOpt(this,(FuncDeclaration *)
                                 &(((Import *)(local_e8._0_8_ + 0x50))->module_name).
                                  _M_string_length);
    local_120._0_8_ = local_e8._0_8_;
    if ((RVar3.enum_ != Error) &&
       (RVar3 = ParseUnboundFuncSignature
                          (this,(FuncSignature *)
                                &(((Import *)(local_e8._0_8_ + 0xa0))->module_name)._M_string_length
                          ), local_120._0_8_ = local_e8._0_8_, RVar3.enum_ != Error)) {
      local_120._8_8_ = local_e8._0_8_;
      local_e8._0_8_ = (Import *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>
                                  *)(local_120 + 8));
      if ((Import *)local_120._8_8_ != (Import *)0x0) {
        (*(*(_func_int ***)local_120._8_8_)[1])();
      }
      local_120._8_8_ = (char *)0x0;
      local_120._0_8_ = local_e8._0_8_;
LAB_0017fefa:
      if ((Import *)local_120._0_8_ != (Import *)0x0) {
        (*((Import *)local_120._0_8_)->_vptr_Import[1])();
      }
      anon_unknown_1::AppendInlineExportFields
                (module,&export_fields,
                 (int)((ulong)((long)(module->tags).
                                     super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(module->tags).
                                    super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
      RVar3 = Expect(this,Rpar);
      EVar4 = (Enum)(RVar3.enum_ == Error);
      goto LAB_0017ff37;
    }
  }
  if ((Import *)local_120._0_8_ != (Import *)0x0) {
    (*((Import *)local_120._0_8_)->_vptr_Import[1])();
  }
LAB_0017ff37:
  intrusive_list<wabt::ModuleField>::clear(&export_fields);
  std::__cxx11::string::_M_dispose();
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseTagModuleField(Module* module) {
  WABT_TRACE(ParseTagModuleField);
  if (!options_->features.exceptions_enabled()) {
    Error(Consume().loc, "tag not allowed");
    return Result::Error;
  }
  EXPECT(Lpar);
  EXPECT(Tag);
  Location loc = GetLocation();

  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Tag));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<TagImport>(name);
    Tag& tag = import->tag;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseTypeUseOpt(&tag.decl));
    CHECK_RESULT(ParseUnboundFuncSignature(&tag.decl.sig));
    CHECK_RESULT(ErrorIfLpar({"type", "param", "result"}));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<TagModuleField>(loc, name);
    CHECK_RESULT(ParseTypeUseOpt(&field->tag.decl));
    CHECK_RESULT(ParseUnboundFuncSignature(&field->tag.decl.sig));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->tags.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}